

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O1

void __thiscall psy::C::DeclarationBinderTester::case0164(DeclarationBinderTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Expectation *pEVar3;
  Decl *pDVar4;
  Ty *this_00;
  socklen_t __len;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  long *local_4e0 [2];
  long local_4d0 [2];
  Expectation local_4c0;
  Expectation local_408;
  Decl local_350;
  Decl local_288;
  Decl local_1c0;
  Decl local_f8;
  
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"x ( y z ) { }","");
  Expectation::Expectation(&local_4c0);
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_500,
             DeclarationBinder::DiagnosticsReporter::
             ID_of_TypeSpecifierMissingDefaultsToInt_abi_cxx11_._M_dataplus._M_p,
             DeclarationBinder::DiagnosticsReporter::
             ID_of_TypeSpecifierMissingDefaultsToInt_abi_cxx11_._M_dataplus._M_p +
             DeclarationBinder::DiagnosticsReporter::
             ID_of_TypeSpecifierMissingDefaultsToInt_abi_cxx11_._M_string_length);
  pEVar3 = Expectation::diagnostic(&local_4c0,Error,&local_500);
  Decl::Decl(&local_f8);
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"x","");
  pDVar4 = Decl::Function(&local_f8,&local_520,File);
  pDVar4 = Ty::Basic(&pDVar4->ty_,Int_S,None);
  pDVar4 = Ty::Derived(&pDVar4->ty_,Function,None,None);
  this_00 = Ty::addParam(&pDVar4->ty_);
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"y","");
  pDVar4 = Ty::Typedef(this_00,&local_540,None);
  local_350.ident_._M_dataplus._M_p = (pointer)&local_350.ident_.field_2;
  pcVar2 = (pDVar4->ident_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_350,pcVar2,pcVar2 + (pDVar4->ident_)._M_string_length);
  local_350.ns_ = pDVar4->ns_;
  local_350.declK_ = pDVar4->declK_;
  local_350.tyDeclK_ = pDVar4->tyDeclK_;
  local_350.symK_ = pDVar4->symK_;
  local_350.scopeK_ = pDVar4->scopeK_;
  Ty::Ty(&local_350.ty_,&pDVar4->ty_);
  pEVar3 = Expectation::declaration(pEVar3,&local_350);
  Decl::Decl(&local_1c0);
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"z","");
  __len = 3;
  pDVar4 = Decl::Object(&local_1c0,&local_560,ParameterDeclaration,Block);
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"y","");
  pDVar4 = Ty::Typedef(&pDVar4->ty_,&local_580,None);
  paVar1 = &local_288.ident_.field_2;
  pcVar2 = (pDVar4->ident_)._M_dataplus._M_p;
  local_288.ident_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar2,pcVar2 + (pDVar4->ident_)._M_string_length);
  local_288.ns_ = pDVar4->ns_;
  local_288.declK_ = pDVar4->declK_;
  local_288.tyDeclK_ = pDVar4->tyDeclK_;
  local_288.symK_ = pDVar4->symK_;
  local_288.scopeK_ = pDVar4->scopeK_;
  Ty::Ty(&local_288.ty_,&pDVar4->ty_);
  pEVar3 = Expectation::declaration(pEVar3,&local_288);
  Expectation::Expectation(&local_408,pEVar3);
  bind(this,(int)local_4e0,(sockaddr *)&local_408,__len);
  if (local_408.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_408.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_408.declarations_);
  if (local_408.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.ambiguityText_._M_dataplus._M_p != &local_408.ambiguityText_.field_2) {
    operator_delete(local_408.ambiguityText_._M_dataplus._M_p,
                    local_408.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_408.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_408.descriptorsE_);
  Ty::~Ty(&local_288.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.ident_._M_dataplus._M_p != paVar1) {
    operator_delete(local_288.ident_._M_dataplus._M_p,
                    local_288.ident_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  Ty::~Ty(&local_1c0.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.ident_._M_dataplus._M_p != &local_1c0.ident_.field_2) {
    operator_delete(local_1c0.ident_._M_dataplus._M_p,
                    local_1c0.ident_.field_2._M_allocated_capacity + 1);
  }
  Ty::~Ty(&local_350.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350.ident_._M_dataplus._M_p != &local_350.ident_.field_2) {
    operator_delete(local_350.ident_._M_dataplus._M_p,
                    local_350.ident_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  Ty::~Ty(&local_f8.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.ident_._M_dataplus._M_p != &local_f8.ident_.field_2) {
    operator_delete(local_f8.ident_._M_dataplus._M_p,
                    local_f8.ident_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_4c0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4c0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4c0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_4c0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_4c0.declarations_);
  if (local_4c0.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4c0.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4c0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4c0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.ambiguityText_._M_dataplus._M_p != &local_4c0.ambiguityText_.field_2) {
    operator_delete(local_4c0.ambiguityText_._M_dataplus._M_p,
                    local_4c0.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c0.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c0.descriptorsE_);
  if (local_4e0[0] != local_4d0) {
    operator_delete(local_4e0[0],local_4d0[0] + 1);
  }
  return;
}

Assistant:

void DeclarationBinderTester::case0164()
{
    bind("x ( y z ) { }",
         Expectation()
             .diagnostic(Expectation::ErrorOrWarn::Error,
                         DeclarationBinder::DiagnosticsReporter::ID_of_TypeSpecifierMissingDefaultsToInt)
             .declaration(Decl()
                      .Function("x", ScopeKind::File)
                      .ty_.Basic(BasicTypeKind::Int_S)
                      .ty_.Derived(TypeKind::Function)
                      .ty_.addParam().Typedef("y"))
             .declaration(Decl()
                      .Object("z", SymbolKind::ParameterDeclaration, ScopeKind::Block)
                      .ty_.Typedef("y")));
}